

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashedSimplePairCache.cpp
# Opt level: O3

cbtSimplePair * __thiscall
cbtHashedSimplePairCache::internalAddPair(cbtHashedSimplePairCache *this,int indexA,int indexB)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  cbtSimplePair *ptr;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  cbtSimplePair *pcVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  uVar3 = (this->m_overlappingPairArray).m_capacity;
  uVar7 = indexB << 0x10 | indexA;
  uVar7 = ~(uVar7 << 0xf) + uVar7;
  uVar7 = (uVar7 >> 10 ^ uVar7) * 9;
  uVar7 = uVar7 >> 6 ^ uVar7;
  uVar7 = ~(uVar7 << 0xb) + uVar7;
  uVar7 = uVar7 >> 0x10 ^ uVar7;
  uVar12 = (ulong)(int)(uVar3 - 1 & uVar7);
  iVar10 = (this->m_hashTable).m_data[uVar12];
  if (iVar10 != -1) {
    pcVar9 = (this->m_overlappingPairArray).m_data;
    do {
      if ((pcVar9[iVar10].m_indexA == indexA) && (pcVar9[iVar10].m_indexB == indexB)) {
        return pcVar9 + iVar10;
      }
      iVar10 = (this->m_next).m_data[iVar10];
    } while (iVar10 != -1);
  }
  uVar4 = (this->m_overlappingPairArray).m_size;
  uVar8 = uVar4;
  if (uVar4 == uVar3) {
    iVar10 = 1;
    if (uVar3 != 0) {
      iVar10 = uVar3 * 2;
    }
    uVar8 = uVar3;
    if ((int)uVar3 < iVar10) {
      if (iVar10 == 0) {
        pcVar9 = (cbtSimplePair *)0x0;
      }
      else {
        pcVar9 = (cbtSimplePair *)cbtAlignedAllocInternal((long)iVar10 << 4,0x10);
        uVar8 = (this->m_overlappingPairArray).m_size;
      }
      if (0 < (int)uVar8) {
        lVar11 = 0;
        do {
          puVar1 = (undefined8 *)((long)&((this->m_overlappingPairArray).m_data)->m_indexA + lVar11)
          ;
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pcVar9->m_indexA + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          lVar11 = lVar11 + 0x10;
        } while ((ulong)uVar8 << 4 != lVar11);
      }
      ptr = (this->m_overlappingPairArray).m_data;
      if ((ptr != (cbtSimplePair *)0x0) && ((this->m_overlappingPairArray).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->m_overlappingPairArray).m_ownsMemory = true;
      (this->m_overlappingPairArray).m_data = pcVar9;
      pcVar9 = pcVar9 + (int)uVar4;
      (this->m_overlappingPairArray).m_capacity = iVar10;
      piVar5 = &(this->m_overlappingPairArray).m_size;
      *piVar5 = *piVar5 + 1;
      if ((int)uVar3 < iVar10) {
        growTables(this);
        uVar12 = (long)(int)uVar7 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
      }
      goto LAB_008c8e00;
    }
  }
  (this->m_overlappingPairArray).m_size = uVar8 + 1;
  pcVar9 = (this->m_overlappingPairArray).m_data + (int)uVar4;
LAB_008c8e00:
  pcVar9->m_indexA = indexA;
  pcVar9->m_indexB = indexB;
  (pcVar9->field_2).m_userPointer = (void *)0x0;
  piVar5 = (this->m_hashTable).m_data;
  (this->m_next).m_data[(int)uVar4] = piVar5[uVar12];
  piVar5[uVar12] = uVar4;
  return pcVar9;
}

Assistant:

cbtSimplePair* cbtHashedSimplePairCache::internalAddPair(int indexA, int indexB)
{
	int hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA), static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity() - 1));  // New hash value with new mask

	cbtSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair != NULL)
	{
		return pair;
	}

	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA), static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity() - 1));
	}

	pair = new (mem) cbtSimplePair(indexA, indexB);

	pair->m_userPointer = 0;

	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}